

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::reset(IMLE *this,Param *prm)

{
  long in_RDI;
  Param *in_stack_00000028;
  IMLE *in_stack_00000030;
  
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::clear
            ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
             0x2f7983);
  setParameters(in_stack_00000030,in_stack_00000028);
  *(undefined4 *)(in_RDI + 0xf0) = 0;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::reset(Param const &prm)
{
    experts.clear();
    setParameters(prm);

    noise_to_go = 0;
}